

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O2

void __thiscall nv::Kernel1::Kernel1(Kernel1 *this,Filter *f,int iscale,int samples)

{
  float *pfVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  int i;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar6 = (float)iscale * f->m_width;
  this->m_width = fVar6;
  fVar6 = ceilf(fVar6 + fVar6);
  uVar4 = (uint)fVar6;
  this->m_windowSize = uVar4;
  uVar3 = 0xffffffffffffffff;
  if (-1 < (int)uVar4) {
    uVar3 = (long)(int)uVar4 * 4;
  }
  pfVar1 = (float *)operator_new__(uVar3);
  this->m_data = pfVar1;
  fVar7 = 0.0;
  for (lVar5 = 0; lVar5 < (int)uVar4; lVar5 = lVar5 + 1) {
    fVar8 = Filter::sampleBox(f,(float)(int)lVar5 - (float)(int)fVar6 * 0.5,1.0 / (float)iscale,
                              samples);
    this->m_data[lVar5] = fVar8;
    fVar7 = fVar7 + fVar8;
    uVar4 = this->m_windowSize;
  }
  pfVar1 = this->m_data;
  uVar2 = 0;
  uVar3 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    pfVar1[uVar2] = pfVar1[uVar2] * (1.0 / fVar7);
  }
  return;
}

Assistant:

Kernel1::Kernel1(const Filter & f, int iscale, int samples/*= 32*/)
{
	nvDebugCheck(iscale > 1);
	nvDebugCheck(samples > 0);
	
	const float scale = 1.0f / iscale;
	
	m_width = f.width() * iscale;
	m_windowSize = (int)ceilf(2 * m_width);
	m_data = new float[m_windowSize];
	
	const float offset = float(m_windowSize) / 2;
	
	float total = 0.0f;
	for (int i = 0; i < m_windowSize; i++)
	{
		const float sample = f.sampleBox(i - offset, scale, samples);
		m_data[i] = sample;
		total += sample;
	}
	
	const float inv = 1.0f / total;
	for (int i = 0; i < m_windowSize; i++)
	{
		m_data[i] *= inv;
	}
}